

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O3

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  uint *puVar1;
  undefined8 uVar2;
  ImDrawList *pIVar3;
  ImDrawVert *pIVar4;
  ImDrawCmd *pIVar5;
  code *pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 in_EAX;
  int iVar9;
  uint uVar10;
  long lVar11;
  unsigned_short *puVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  GLint last_tex_env_mode;
  GLint last_texture;
  GLint last_polygon_mode [2];
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  undefined4 local_c0;
  undefined4 local_bc;
  ImDrawData *local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  long local_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar16 = (float)(int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fVar19 = (float)(int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar7._4_4_ = -(uint)(fVar16 == 0.0);
  auVar7._0_4_ = -(uint)(fVar16 == 0.0);
  auVar7._8_4_ = -(uint)(fVar19 == 0.0);
  auVar7._12_4_ = -(uint)(fVar19 == 0.0);
  iVar9 = movmskpd(in_EAX,auVar7);
  if (iVar9 == 0) {
    local_a8.y = fVar19;
    local_a8.x = fVar16;
    uStack_a0 = 0;
    glGetIntegerv(0x8069,&local_bc);
    glGetIntegerv(0xb40,&local_b0);
    glGetIntegerv(0xba2,&local_88);
    glGetIntegerv(0xc10,&local_98);
    glGetTexEnviv(0x2300,0x2200,&local_c0);
    glPushAttrib(0x7000);
    fVar16 = local_a8.x;
    fVar19 = local_a8.y;
    ImGui_ImplOpenGL2_SetupRenderState(draw_data,(int)local_a8.x,(int)local_a8.y);
    if (0 < draw_data->CmdListsCount) {
      local_a8 = draw_data->DisplayPos;
      local_68 = draw_data->FramebufferScale;
      local_48 = local_68.y;
      fVar17 = (float)(int)fVar19;
      uStack_60 = 0;
      uStack_a0 = 0;
      local_58 = local_a8.y;
      lVar11 = 0;
      local_b8 = draw_data;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      do {
        pIVar3 = local_b8->CmdLists[lVar11];
        puVar12 = (pIVar3->IdxBuffer).Data;
        pIVar4 = (pIVar3->VtxBuffer).Data;
        local_70 = lVar11;
        glVertexPointer(2,0x1406,0x14,pIVar4);
        glTexCoordPointer(2,0x1406,0x14,&pIVar4->uv);
        glColorPointer(4,0x1401,0x14,&pIVar4->col);
        if (0 < (pIVar3->CmdBuffer).Size) {
          lVar13 = 0;
          lVar11 = 0;
          do {
            pIVar5 = (pIVar3->CmdBuffer).Data;
            puVar1 = (uint *)((long)&pIVar5->ElemCount + lVar13);
            pcVar6 = *(code **)((long)&pIVar5->UserCallback + lVar13);
            if (pcVar6 == (code *)0x0) {
              fVar14 = (*(float *)((long)&(pIVar5->ClipRect).x + lVar13) - local_a8.x) * local_68.x;
              if ((fVar14 < (float)(int)fVar16) &&
                 (fVar15 = (*(float *)((long)&(pIVar5->ClipRect).y + lVar13) - local_58) * local_48,
                 fVar15 < fVar17)) {
                uVar2 = *(undefined8 *)((long)&(pIVar5->ClipRect).z + lVar13);
                fVar18 = ((float)uVar2 - local_a8.x) * local_68.x;
                fVar20 = ((float)((ulong)uVar2 >> 0x20) - local_a8.y) * local_68.y;
                iVar9 = -(uint)(0.0 <= fVar18);
                auVar8._4_4_ = iVar9;
                auVar8._0_4_ = iVar9;
                auVar8._8_4_ = -(uint)(0.0 <= fVar20);
                auVar8._12_4_ = -(uint)(0.0 <= fVar20);
                uVar10 = movmskpd(0,auVar8);
                if (((uVar10 & 1) != 0) && ((byte)((byte)uVar10 >> 1) != 0)) {
                  glScissor((int)fVar14,(int)(fVar17 - fVar20),(int)(fVar18 - fVar14),
                            (int)(fVar20 - fVar15));
                  glBindTexture(0xde1,*(undefined4 *)((long)&pIVar5->TextureId + lVar13));
                  glDrawElements(4,*(undefined4 *)((long)&pIVar5->ElemCount + lVar13),0x1403,puVar12
                                );
                }
              }
            }
            else if (pcVar6 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL2_SetupRenderState(local_b8,(int)fVar16,(int)fVar19);
            }
            else {
              (*pcVar6)(pIVar3,puVar1);
            }
            puVar12 = puVar12 + *puVar1;
            lVar11 = lVar11 + 1;
            lVar13 = lVar13 + 0x38;
          } while (lVar11 < (pIVar3->CmdBuffer).Size);
        }
        lVar11 = local_70 + 1;
      } while (lVar11 < local_b8->CmdListsCount);
    }
    glDisableClientState(0x8076);
    glDisableClientState(0x8078);
    glDisableClientState(0x8074);
    glBindTexture(0xde1,local_bc);
    glMatrixMode(0x1700);
    glPopMatrix();
    glMatrixMode(0x1701);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(0x404,local_b0);
    glPolygonMode(0x405,local_ac);
    glViewport(local_88,local_84,local_80,local_7c);
    glScissor(local_98,local_94,local_90,local_8c);
    glTexEnvi(0x2300,0x2200,local_c0);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer);
                }
            }
            idx_buffer += pcmd->ElemCount;
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}